

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O1

Result __thiscall
wabt::SharedValidator::OnLocalGet(SharedValidator *this,Location *loc,Var *param_2)

{
  Result RVar1;
  Enum EVar2;
  Result RVar3;
  Type type;
  Type local_78;
  Var local_70;
  
  RVar1 = CheckInstr(this,(Opcode)0x19,loc);
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    local_78.enum_ = Any;
    local_78.type_index_ = 0xffffffff;
    Var::Var(&local_70,param_2);
    RVar1 = CheckLocalIndex(this,&local_70,&local_78);
    Var::~Var(&local_70);
    RVar3 = TypeChecker::OnLocalGet(&this->typechecker_,local_78);
    EVar2 = (Enum)(RVar3.enum_ == Error || RVar1.enum_ == Error);
  }
  return (Result)EVar2;
}

Assistant:

Result SharedValidator::OnLocalGet(const Location& loc, Var local_var) {
  CHECK_RESULT(CheckInstr(Opcode::LocalGet, loc));
  Result result = Result::Ok;
  Type type = Type::Any;
  result |= CheckLocalIndex(local_var, &type);
  result |= typechecker_.OnLocalGet(type);
  return result;
}